

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnEndExpr(BinaryReaderInterp *this)

{
  LabelType LVar1;
  Istream *this_00;
  bool bVar2;
  Result RVar3;
  Label *pLVar4;
  LabelType label_type;
  Label *label;
  BinaryReaderInterp *this_local;
  
  label = (Label *)this;
  RVar3 = SharedValidator::GetLabel(&this->validator_,0,(Label **)&label_type);
  bVar2 = Failed(RVar3);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    LVar1 = _label_type->label_type;
    RVar3 = SharedValidator::OnEnd
                      (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc)
    ;
    bVar2 = Failed(RVar3);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      if ((LVar1 == If) || (LVar1 == Else)) {
        this_00 = this->istream_;
        pLVar4 = TopLabel(this);
        Istream::ResolveFixupU32(this_00,pLVar4->fixup_offset);
      }
      FixupTopLabel(this);
      PopLabel(this);
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnEndExpr() {
  SharedValidator::Label* label;
  CHECK_RESULT(validator_.GetLabel(0, &label));
  LabelType label_type = label->label_type;
  CHECK_RESULT(validator_.OnEnd(loc));
  if (label_type == LabelType::If || label_type == LabelType::Else) {
    istream_.ResolveFixupU32(TopLabel()->fixup_offset);
  }
  FixupTopLabel();
  PopLabel();
  return Result::Ok;
}